

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::GetSetParameterTest::CompareAndLog
          (GetSetParameterTest *this,GLfloat *value_src,GLfloat *value_dst,GLenum pname)

{
  ostringstream *this_00;
  float fVar1;
  float fVar2;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  fVar1 = *value_src - *value_dst;
  fVar2 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar2 = fVar1;
  }
  if (fVar2 <= 0.0125) {
    fVar1 = value_src[1] - value_dst[1];
    fVar2 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar2 = fVar1;
    }
    if (fVar2 <= 0.0125) {
      fVar1 = value_src[2] - value_dst[2];
      fVar2 = -fVar1;
      if (-fVar1 <= fVar1) {
        fVar2 = fVar1;
      }
      if (fVar2 <= 0.0125) {
        fVar1 = value_src[3] - value_dst[3];
        fVar2 = -fVar1;
        if (-fVar1 <= fVar1) {
          fVar2 = fVar1;
        }
        if (fVar2 <= 0.0125) {
          return true;
        }
      }
    }
  }
  local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Queried value of pname ",0x17);
  local_1b0.m_getName = glu::getTextureParameterName;
  local_1b0.m_value = pname;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," is equal to [",0xe);
  std::ostream::_M_insert<double>((double)*value_dst);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  std::ostream::_M_insert<double>((double)value_dst[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  std::ostream::_M_insert<double>((double)value_dst[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  std::ostream::_M_insert<double>((double)value_dst[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], however ",0xb);
  std::ostream::_M_insert<double>((double)*value_src);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  std::ostream::_M_insert<double>((double)value_src[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  std::ostream::_M_insert<double>((double)value_src[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  std::ostream::_M_insert<double>((double)value_src[3]);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"] was expected. Test fails.",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_128);
  return false;
}

Assistant:

bool GetSetParameterTest::CompareAndLog(glw::GLfloat value_src[4], glw::GLfloat value_dst[4], glw::GLenum pname)
{
	if ((de::abs(value_src[0] - value_dst[0]) > 0.0125 /* Precision */) ||
		(de::abs(value_src[1] - value_dst[1]) > 0.0125 /* Precision */) ||
		(de::abs(value_src[2] - value_dst[2]) > 0.0125 /* Precision */) ||
		(de::abs(value_src[3] - value_dst[3]) > 0.0125 /* Precision */))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Queried value of pname " << glu::getTextureParameterStr(pname)
			<< " is equal to [" << value_dst[0] << ", " << value_dst[1] << ", " << value_dst[2] << ", " << value_dst[3]
			<< "], however " << value_src[0] << ", " << value_src[1] << ", " << value_src[2] << ", " << value_src[3]
			<< "] was expected. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}